

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::
write_significand<char,fmt::v11::basic_appender<char>,unsigned_int,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,uint significand,int significand_size,int exponent,
          digit_grouping<char> *grouping)

{
  bool bVar1;
  basic_appender<char> out_00;
  char *s;
  size_t count;
  basic_string_view<char> local_2c0;
  basic_appender<char> local_2b0;
  buffer<char> *local_2a8;
  char local_299;
  basic_appender<char> local_298;
  buffer<char> *local_290;
  basic_appender<char> local_278;
  allocator<char> local_269;
  undefined1 local_268 [8];
  memory_buffer buffer;
  digit_grouping<char> *grouping_local;
  int exponent_local;
  int significand_size_local;
  uint significand_local;
  basic_appender<char> out_local;
  
  bVar1 = digit_grouping<char>::has_separator(grouping);
  if (bVar1) {
    basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *)local_268,
               &local_269);
    basic_appender<char>::basic_appender(&local_278,(buffer<char> *)local_268);
    local_290 = (buffer<char> *)
                write_significand<char,fmt::v11::basic_appender<char>,unsigned_int>
                          (local_278,significand,significand_size);
    basic_appender<char>::basic_appender(&local_298,(buffer<char> *)local_268);
    local_299 = '0';
    local_2a8 = (buffer<char> *)
                fill_n<fmt::v11::basic_appender<char>,int,char>(local_298,exponent,&local_299);
    local_2b0.container = out.container;
    s = buffer<char>::data((buffer<char> *)local_268);
    count = buffer<char>::size((buffer<char> *)local_268);
    basic_string_view<char>::basic_string_view(&local_2c0,s,count);
    out_local = digit_grouping<char>::apply<fmt::v11::basic_appender<char>,char>
                          (grouping,local_2b0,local_2c0);
    basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::~basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *)local_268);
  }
  else {
    out_00 = write_significand<char,fmt::v11::basic_appender<char>,unsigned_int>
                       (out,significand,significand_size);
    buffer._535_1_ = 0x30;
    out_local = fill_n<fmt::v11::basic_appender<char>,int,char>(out_00,exponent,&buffer.field_0x217)
    ;
  }
  return (basic_appender<char>)out_local.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int exponent,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.has_separator()) {
    out = write_significand<Char>(out, significand, significand_size);
    return detail::fill_n(out, exponent, static_cast<Char>('0'));
  }
  auto buffer = memory_buffer();
  write_significand<char>(appender(buffer), significand, significand_size);
  detail::fill_n(appender(buffer), exponent, '0');
  return grouping.apply(out, string_view(buffer.data(), buffer.size()));
}